

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O2

string * utils::getTimestamp_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  allocator<char> local_b1;
  time_t now;
  tm local_a8;
  char buf [80];
  
  now = time((time_t *)0x0);
  ptVar1 = localtime(&now);
  local_a8.tm_sec = ptVar1->tm_sec;
  local_a8.tm_min = ptVar1->tm_min;
  local_a8.tm_hour = ptVar1->tm_hour;
  local_a8.tm_mday = ptVar1->tm_mday;
  local_a8.tm_mon = ptVar1->tm_mon;
  local_a8.tm_year = ptVar1->tm_year;
  local_a8.tm_wday = ptVar1->tm_wday;
  local_a8.tm_yday = ptVar1->tm_yday;
  local_a8.tm_isdst = ptVar1->tm_isdst;
  local_a8._36_4_ = *(undefined4 *)&ptVar1->field_0x24;
  local_a8.tm_gmtoff = ptVar1->tm_gmtoff;
  local_a8.tm_zone = ptVar1->tm_zone;
  strftime(buf,0x50,"%X",&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,buf,&local_b1);
  return in_RDI;
}

Assistant:

std::string utils::getTimestamp()
{
    time_t now = time(nullptr);
    struct tm tstruct = tm();
#ifdef WIN32
    localtime_s(&tstruct, &now);
#else
    tstruct = *localtime(&now);
#endif
    char buf[80];
    strftime(static_cast<char*>(buf), sizeof(buf), "%X", &tstruct);
    return std::string(static_cast<char*>(buf));
}